

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_examples.cpp
# Opt level: O3

bool math::wide_integer::test_uintwide_t_examples(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ostream *poVar23;
  
  bVar1 = example000_numeric_limits();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example000_numeric_limits     : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar2 = example000a_builtin_convert();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example000a_builtin_convert   : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar3 = example001_mul_div();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example001_mul_div            : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar4 = example001a_div_mod();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example001a_div_mod           : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar5 = example002_shl_shr();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example002_shl_shr            : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar6 = example003_sqrt();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example003_sqrt               : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar7 = example003a_cbrt();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example003a_cbrt              : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar8 = example004_rootk_pow();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example004_rootk_pow          : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar9 = example005_powm();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example005_powm               : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar10 = example005a_pow_factors_of_p99();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example005a_pow_factors_of_p99: ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar11 = example006_gcd();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example006_gcd                : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar12 = example007_random_generator();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example007_random_generator   : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar13 = example008_miller_rabin_prime();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example008_miller_rabin_prime : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar14 = example008a_miller_rabin_prime();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example008a_miller_rabin_prime: ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar15 = example009_timed_mul();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example009_timed_mul          : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar16 = example009a_timed_mul_4_by_4();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example009a_timed_mul_4_by_4  : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar17 = example009b_timed_mul_8_by_8();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example009b_timed_mul_8_by_8  : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar18 = example010_uint48_t();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example010_uint48_t           : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar19 = example011_uint24_t();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example011_uint24_t           : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar20 = example012_rsa_crypto();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example012_rsa_crypto         : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar21 = example013_ecdsa_sign_verify();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example013_ecdsa_sign_verify  : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  bVar22 = example014_pi_spigot_wide();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"result_is_ok after example014_pi_spigot_wide     : ",0x33);
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar23 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  return ((((((((((((((((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) &&
                      bVar8) && bVar9) && bVar10) && bVar11) && bVar12) && bVar13) && bVar14) &&
               bVar15) && bVar16) && bVar17) && bVar18) && bVar19) && bVar20) && bVar21) && bVar22;
}

Assistant:

auto ::math::wide_integer::test_uintwide_t_examples() -> bool
#endif
{
  bool result_is_ok = true;

  result_is_ok = (math::wide_integer::example000_numeric_limits     () && result_is_ok); std::cout << "result_is_ok after example000_numeric_limits     : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example000a_builtin_convert   () && result_is_ok); std::cout << "result_is_ok after example000a_builtin_convert   : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example001_mul_div            () && result_is_ok); std::cout << "result_is_ok after example001_mul_div            : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example001a_div_mod           () && result_is_ok); std::cout << "result_is_ok after example001a_div_mod           : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example002_shl_shr            () && result_is_ok); std::cout << "result_is_ok after example002_shl_shr            : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example003_sqrt               () && result_is_ok); std::cout << "result_is_ok after example003_sqrt               : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example003a_cbrt              () && result_is_ok); std::cout << "result_is_ok after example003a_cbrt              : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example004_rootk_pow          () && result_is_ok); std::cout << "result_is_ok after example004_rootk_pow          : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example005_powm               () && result_is_ok); std::cout << "result_is_ok after example005_powm               : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example005a_pow_factors_of_p99() && result_is_ok); std::cout << "result_is_ok after example005a_pow_factors_of_p99: " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example006_gcd                () && result_is_ok); std::cout << "result_is_ok after example006_gcd                : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example007_random_generator   () && result_is_ok); std::cout << "result_is_ok after example007_random_generator   : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example008_miller_rabin_prime () && result_is_ok); std::cout << "result_is_ok after example008_miller_rabin_prime : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example008a_miller_rabin_prime() && result_is_ok); std::cout << "result_is_ok after example008a_miller_rabin_prime: " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example009_timed_mul          () && result_is_ok); std::cout << "result_is_ok after example009_timed_mul          : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example009a_timed_mul_4_by_4  () && result_is_ok); std::cout << "result_is_ok after example009a_timed_mul_4_by_4  : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example009b_timed_mul_8_by_8  () && result_is_ok); std::cout << "result_is_ok after example009b_timed_mul_8_by_8  : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example010_uint48_t           () && result_is_ok); std::cout << "result_is_ok after example010_uint48_t           : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example011_uint24_t           () && result_is_ok); std::cout << "result_is_ok after example011_uint24_t           : " << std::boolalpha << result_is_ok << std::endl;
  #if !(defined(_MSC_VER) && defined(_DEBUG))
  result_is_ok = (math::wide_integer::example012_rsa_crypto         () && result_is_ok); std::cout << "result_is_ok after example012_rsa_crypto         : " << std::boolalpha << result_is_ok << std::endl;
  #endif
  result_is_ok = (math::wide_integer::example013_ecdsa_sign_verify  () && result_is_ok); std::cout << "result_is_ok after example013_ecdsa_sign_verify  : " << std::boolalpha << result_is_ok << std::endl;
  result_is_ok = (math::wide_integer::example014_pi_spigot_wide     () && result_is_ok); std::cout << "result_is_ok after example014_pi_spigot_wide     : " << std::boolalpha << result_is_ok << std::endl;

  return result_is_ok;
}